

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  string real_destination;
  string destination_dir;
  ifstream fin;
  ofstream fout;
  char buffer [4096];
  string local_1480;
  string local_1460;
  string local_1440;
  byte abStack_1420 [488];
  undefined1 local_1238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1228;
  byte abStack_1218 [216];
  ios_base local_1140 [264];
  stat64 local_1038 [28];
  
  bVar3 = SameFile(source,destination);
  if (bVar3) {
    return true;
  }
  iVar4 = stat64((source->_M_dataplus)._M_p,local_1038);
  local_1480._M_dataplus._M_p = (pointer)&local_1480.field_2;
  pcVar2 = (destination->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1480,pcVar2,pcVar2 + destination->_M_string_length);
  paVar1 = &local_1460.field_2;
  local_1460._M_string_length = 0;
  local_1460.field_2._M_local_buf[0] = '\0';
  local_1460._M_dataplus._M_p = (pointer)paVar1;
  if (((destination->_M_string_length == 0) ||
      (iVar5 = access((destination->_M_dataplus)._M_p,4), iVar5 != 0)) ||
     (bVar3 = FileIsDirectory(destination), !bVar3)) {
    GetFilenamePath(&local_1440,destination);
    std::__cxx11::string::operator=((string *)&local_1460,(string *)&local_1440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1440._M_dataplus._M_p != &local_1440.field_2) goto LAB_00123e3f;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_1460);
    ConvertToUnixSlashes(&local_1480);
    std::__cxx11::string::push_back((char)&local_1480);
    pcVar2 = (source->_M_dataplus)._M_p;
    local_1440._M_dataplus._M_p = (pointer)&local_1440.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1440,pcVar2,pcVar2 + source->_M_string_length);
    GetFilenameName((string *)local_1238,&local_1440);
    std::__cxx11::string::_M_append((char *)&local_1480,local_1238._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1238._0_8_ != &local_1228) {
      operator_delete((void *)local_1238._0_8_,local_1228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1440._M_dataplus._M_p != &local_1440.field_2) {
LAB_00123e3f:
      operator_delete(local_1440._M_dataplus._M_p,local_1440.field_2._M_allocated_capacity + 1);
    }
  }
  MakeDirectory(&local_1460);
  std::ifstream::ifstream(&local_1440,(source->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_1420[*(long *)(local_1440._M_dataplus._M_p + -0x18)] & 5) != 0) {
    bVar3 = false;
    goto LAB_00123f89;
  }
  RemoveFile(&local_1480);
  std::ofstream::ofstream(local_1238,local_1480._M_dataplus._M_p,_S_trunc|_S_out|_S_bin);
  if ((abStack_1218[*(long *)(local_1238._0_8_ + -0x18)] & 5) == 0) {
    while (((abStack_1420[*(long *)(local_1440._M_dataplus._M_p + -0x18)] & 5) == 0 &&
           (std::istream::read((char *)&local_1440,(long)local_1038),
           local_1440._M_string_length != 0))) {
      std::ostream::write(local_1238,(long)local_1038);
    }
    std::ostream::flush();
    std::ifstream::close();
    std::ofstream::close();
    if (((abStack_1218[*(long *)(local_1238._0_8_ + -0x18)] & 5) != 0) ||
       ((-1 < iVar4 && (bVar3 = SetPermissions(&local_1480,local_1038[0].st_mode), !bVar3))))
    goto LAB_00123f4a;
    bVar3 = true;
  }
  else {
LAB_00123f4a:
    bVar3 = false;
  }
  local_1238._0_8_ = _VTT;
  *(undefined8 *)(local_1238 + *(long *)(_VTT->_M_local_buf + -0x18)) = _strtod;
  std::filebuf::~filebuf((filebuf *)(local_1238 + 8));
  std::ios_base::~ios_base(local_1140);
LAB_00123f89:
  std::ifstream::~ifstream(&local_1440);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1460._M_dataplus._M_p != paVar1) {
    operator_delete(local_1460._M_dataplus._M_p,
                    CONCAT71(local_1460.field_2._M_allocated_capacity._1_7_,
                             local_1460.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1480._M_dataplus._M_p != &local_1480.field_2) {
    operator_delete(local_1480._M_dataplus._M_p,local_1480.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool SystemTools::CopyFileAlways(const kwsys_stl::string& source, const kwsys_stl::string& destination)
{
  // If files are the same do not copy
  if ( SystemTools::SameFile(source, destination) )
    {
    return true;
    }
  mode_t perm = 0;
  bool perms = SystemTools::GetPermissions(source, perm);

  const int bufferSize = 4096;
  char buffer[bufferSize];

  // If destination is a directory, try to create a file with the same
  // name as the source in that directory.

  kwsys_stl::string real_destination = destination;
  kwsys_stl::string destination_dir;
  if(SystemTools::FileExists(destination) &&
     SystemTools::FileIsDirectory(destination))
    {
    destination_dir = real_destination;
    SystemTools::ConvertToUnixSlashes(real_destination);
    real_destination += '/';
    kwsys_stl::string source_name = source;
    real_destination += SystemTools::GetFilenameName(source_name);
    }
  else
    {
    destination_dir = SystemTools::GetFilenamePath(destination);
    }

  // Create destination directory

  SystemTools::MakeDirectory(destination_dir);

  // Open files
#if defined(_WIN32)
  kwsys::ifstream fin(Encoding::ToNarrow(
    SystemTools::ConvertToWindowsExtendedPath(source)).c_str(),
                kwsys_ios::ios::in | kwsys_ios_binary);
#else
  kwsys::ifstream fin(source.c_str(),
                kwsys_ios::ios::in | kwsys_ios_binary);
#endif
  if(!fin)
    {
    return false;
    }

  // try and remove the destination file so that read only destination files
  // can be written to.
  // If the remove fails continue so that files in read only directories
  // that do not allow file removal can be modified.
  SystemTools::RemoveFile(real_destination);

#if defined(_WIN32)
  kwsys::ofstream fout(Encoding::ToNarrow(
    SystemTools::ConvertToWindowsExtendedPath(real_destination)).c_str(),
                     kwsys_ios::ios::out | kwsys_ios::ios::trunc | kwsys_ios_binary);
#else
  kwsys::ofstream fout(real_destination.c_str(),
                     kwsys_ios::ios::out | kwsys_ios::ios::trunc | kwsys_ios_binary);
#endif
  if(!fout)
    {
    return false;
    }

  // This copy loop is very sensitive on certain platforms with
  // slightly broken stream libraries (like HPUX).  Normally, it is
  // incorrect to not check the error condition on the fin.read()
  // before using the data, but the fin.gcount() will be zero if an
  // error occurred.  Therefore, the loop should be safe everywhere.
  while(fin)
    {
    fin.read(buffer, bufferSize);
    if(fin.gcount())
      {
      fout.write(buffer, fin.gcount());
      }
    else
      {
      break;
      }
    }

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();

  fin.close();
  fout.close();

  if(!fout)
    {
    return false;
    }
  if ( perms )
    {
    if ( !SystemTools::SetPermissions(real_destination, perm) )
      {
      return false;
      }
    }
  return true;
}